

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall avro::NodePrimitive::~NodePrimitive(NodePrimitive *this)

{
  void *in_RDI;
  
  ~NodePrimitive((NodePrimitive *)0x25d0c8);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

class AVRO_DECL NodePrimitive : public NodeImplPrimitive
{
  public:

    explicit NodePrimitive(Type type) :
        NodeImplPrimitive(type)
    { }

    SchemaResolution resolve(const Node &reader)  const;

    void printJson(std::ostream &os, int depth) const;

    bool isValid() const {
        return true;
    }
}